

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O3

void __thiscall ParserTest_SimpleTerms_Test::TestBody(ParserTest_SimpleTerms_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_Node_*,_false> _Var2;
  Node *pNVar3;
  _Head_base<0UL,_Node_*,_false> local_d0;
  string local_c8;
  _Head_base<0UL,_Node_*,_false> local_a8;
  _Head_base<0UL,_Node_*,_false> local_a0;
  _Head_base<0UL,_Node_*,_false> local_98;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_90;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_70;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_50;
  
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"42","");
  local_50.super__Function_base._M_functor._M_unused._M_object = Parser::parseTerm;
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_manager;
  pNVar3 = (Node *)operator_new(0x18);
  (pNVar3->mark_).line = 1;
  (pNVar3->mark_).column = 0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_001e9ac0;
  pNVar3[1]._vptr_Node = (_func_int **)0x4045000000000000;
  local_98._M_head_impl = pNVar3;
  setupTest(&local_c8,&local_50,(unique_ptr<Node,_std::default_delete<Node>_> *)&local_98);
  (*pNVar3->_vptr_Node[1])(pNVar3);
  local_98._M_head_impl = (Node *)0x0;
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"12.5","");
  local_70.super__Function_base._M_functor._M_unused._M_object = Parser::parseTerm;
  local_70.super__Function_base._M_functor._8_8_ = 0;
  local_70._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_70.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_manager;
  pNVar3 = (Node *)operator_new(0x18);
  (pNVar3->mark_).line = 1;
  (pNVar3->mark_).column = 0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_001e9ac0;
  pNVar3[1]._vptr_Node = (_func_int **)0x4029000000000000;
  local_a0._M_head_impl = pNVar3;
  setupTest(&local_c8,&local_70,(unique_ptr<Node,_std::default_delete<Node>_> *)&local_a0);
  (*pNVar3->_vptr_Node[1])(pNVar3);
  local_a0._M_head_impl = (Node *)0x0;
  if (local_70.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.super__Function_base._M_manager)
              ((_Any_data *)&local_70,(_Any_data *)&local_70,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"x","");
  local_90.super__Function_base._M_functor._M_unused._M_object = Parser::parseTerm;
  local_90.super__Function_base._M_functor._8_8_ = 0;
  local_90._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_90.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_manager;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_d0);
  _Var2._M_head_impl = local_d0._M_head_impl;
  local_d0._M_head_impl = (Node *)0x0;
  local_a8._M_head_impl = _Var2._M_head_impl;
  setupTest(&local_c8,&local_90,(unique_ptr<Node,_std::default_delete<Node>_> *)&local_a8);
  if (_Var2._M_head_impl != (Node *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_Node[1])(_Var2._M_head_impl);
  }
  local_a8._M_head_impl = (Node *)0x0;
  if (local_d0._M_head_impl != (Node *)0x0) {
    (*(local_d0._M_head_impl)->_vptr_Node[1])();
  }
  if (local_90.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_90.super__Function_base._M_manager)
              ((_Any_data *)&local_90,(_Any_data *)&local_90,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(ParserTest, BinaryExpr)
{
  auto node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2), 
      BinaryOperator::BinaryAnd, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("2 & 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(5), 
      BinaryOperator::BinaryOr, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("5 | 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<VariableNode>("x"), 
      BinaryOperator::BinaryXor, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("x ^ 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftLeft, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 << 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftRight, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 >> 2", &Parser::parseArithmeticExpression, std::move(node));
}